

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

pair<jbcoin::PublicKey,_jbcoin::SecretKey> *
jbcoin::generateKeyPair
          (pair<jbcoin::PublicKey,_jbcoin::SecretKey> *__return_storage_ptr__,KeyType type,
          Seed *seed)

{
  PublicKey local_98;
  undefined1 local_64 [8];
  SecretKey sk;
  undefined1 local_38 [8];
  Generator g;
  Seed *seed_local;
  KeyType type_local;
  
  g.gen_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)seed;
  if (type == secp256k1) {
    Generator::Generator((Generator *)local_38,seed);
    Generator::operator()
              (__return_storage_ptr__,(Generator *)local_38,
               (Seed *)g.gen_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    Generator::~Generator((Generator *)local_38);
  }
  else {
    generateSecretKey((SecretKey *)local_64,type,seed);
    derivePublicKey(&local_98,type,(SecretKey *)local_64);
    std::pair<jbcoin::PublicKey,_jbcoin::SecretKey>::pair<jbcoin::PublicKey,_true>
              (__return_storage_ptr__,&local_98,(SecretKey *)local_64);
    SecretKey::~SecretKey((SecretKey *)local_64);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<PublicKey, SecretKey>
generateKeyPair (KeyType type, Seed const& seed)
{
    switch(type)
    {
    case KeyType::secp256k1:
    {
        Generator g(seed);
        return g(seed, 0);
    }
    default:
    case KeyType::ed25519:
    {
        auto const sk = generateSecretKey(type, seed);
        return { derivePublicKey(type, sk), sk };
    }
    }
}